

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockNamedValue.cpp
# Opt level: O0

void __thiscall
MockNamedValueComparatorsAndCopiersRepository::installComparatorsAndCopiers
          (MockNamedValueComparatorsAndCopiersRepository *this,
          MockNamedValueComparatorsAndCopiersRepository *repository)

{
  MockNamedValueComparatorsAndCopiersRepositoryNode *this_00;
  MockNamedValueComparatorsAndCopiersRepositoryNode *local_20;
  MockNamedValueComparatorsAndCopiersRepositoryNode *p;
  MockNamedValueComparatorsAndCopiersRepository *repository_local;
  MockNamedValueComparatorsAndCopiersRepository *this_local;
  
  for (local_20 = repository->head_;
      local_20 != (MockNamedValueComparatorsAndCopiersRepositoryNode *)0x0;
      local_20 = local_20->next_) {
    this_00 = (MockNamedValueComparatorsAndCopiersRepositoryNode *)
              operator_new(0x28,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTestExt/MockNamedValue.cpp"
                           ,0x295);
    MockNamedValueComparatorsAndCopiersRepositoryNode::
    MockNamedValueComparatorsAndCopiersRepositoryNode
              (this_00,&local_20->name_,local_20->comparator_,local_20->copier_,this->head_);
    this->head_ = this_00;
  }
  return;
}

Assistant:

void MockNamedValueComparatorsAndCopiersRepository::installComparatorsAndCopiers(const MockNamedValueComparatorsAndCopiersRepository& repository)
{
    for (MockNamedValueComparatorsAndCopiersRepositoryNode* p = repository.head_; p; p = p->next_)
      head_ = new MockNamedValueComparatorsAndCopiersRepositoryNode(p->name_, p->comparator_, p->copier_, head_);
}